

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertTrue
          (UtestShell *this,bool condition,char *checkString,char *conditionString,char *text,
          char *fileName,int lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  byte in_SIL;
  long *in_RDI;
  SimpleString *in_R9;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_ffffffffffffff48;
  SimpleString *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  UtestShell *in_stack_ffffffffffffff88;
  CheckFailure *in_stack_ffffffffffffff90;
  SimpleString *in_stack_ffffffffffffffa0;
  
  pTVar1 = getTestResult(in_stack_ffffffffffffff48);
  (*pTVar1->_vptr_TestResult[10])();
  if ((in_SIL & 1) == 0) {
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    SimpleString::SimpleString(in_R9,(char *)in_stack_ffffffffffffff48);
    CheckFailure::CheckFailure
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffffa0);
    (**(code **)(*in_RDI + 0x128))(in_RDI,&stack0xffffffffffffff90,in_stack_00000010);
    CheckFailure::~CheckFailure((CheckFailure *)0x217e7e);
    SimpleString::~SimpleString((SimpleString *)0x217e88);
    SimpleString::~SimpleString((SimpleString *)0x217e92);
    SimpleString::~SimpleString((SimpleString *)0x217e9c);
  }
  return;
}

Assistant:

void UtestShell::assertTrue(bool condition, const char *checkString, const char *conditionString, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!condition)
        failWith(CheckFailure(this, fileName, lineNumber, checkString, conditionString, text), testTerminator);
}